

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  long lVar1;
  bool bVar2;
  TestCaseInfo *pTVar3;
  reference this_00;
  ostream *poVar4;
  TestCase *in_RSI;
  long *in_RDI;
  TestCase *prev;
  ostringstream oss;
  string name;
  SourceLineInfo *in_stack_fffffffffffffc28;
  key_type *in_stack_fffffffffffffc30;
  value_type *in_stack_fffffffffffffc38;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_fffffffffffffc40;
  value_type *in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  TestCase *in_stack_fffffffffffffc58;
  _Self local_2d8;
  _Self local_2d0;
  undefined4 local_2c4;
  string local_2c0 [32];
  undefined1 local_2a0 [232];
  ostringstream local_1b8 [392];
  string local_30 [32];
  TestCase *local_10;
  
  local_10 = in_RSI;
  pTVar3 = TestCase::getTestCaseInfo(in_RSI);
  std::__cxx11::string::string(local_30,(string *)pTVar3);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar4 = std::operator<<((ostream *)local_1b8,"Anonymous test case ");
    lVar1 = in_RDI[0xd];
    in_RDI[0xd] = lVar1 + 1U;
    std::ostream::operator<<(poVar4,lVar1 + 1U);
    std::__cxx11::ostringstream::str();
    TestCase::withName(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    (**(code **)(*in_RDI + 0x20))(in_RDI,local_2a0);
    TestCase::~TestCase(in_stack_fffffffffffffc30);
    std::__cxx11::string::~string(local_2c0);
    local_2c4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else {
    local_2d0._M_node =
         (_Base_ptr)
         std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
         find((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
              in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    local_2d8._M_node =
         (_Base_ptr)
         std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
         end((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
             in_stack_fffffffffffffc28);
    bVar2 = std::operator==(&local_2d0,&local_2d8);
    if (!bVar2) {
      std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::find
                ((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                  *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
      this_00 = std::_Rb_tree_const_iterator<Catch::TestCase>::operator*
                          ((_Rb_tree_const_iterator<Catch::TestCase> *)0x181296);
      poVar4 = std::operator<<((ostream *)&std::cerr,"error: TEST_CASE( \"");
      poVar4 = std::operator<<(poVar4,local_30);
      poVar4 = std::operator<<(poVar4,"\" ) already defined.\n");
      std::operator<<(poVar4,"\tFirst seen at ");
      TestCase::getTestCaseInfo(this_00);
      SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      poVar4 = operator<<((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      poVar4 = std::operator<<(poVar4,"\n");
      std::operator<<(poVar4,"\tRedefined at ");
      TestCase::getTestCaseInfo(local_10);
      SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      poVar4 = operator<<((ostream *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x1813cf);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x1813dc);
      exit(1);
    }
    std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::insert
              ((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *
               )in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    bVar2 = TestCase::isHidden(local_10);
    if (!bVar2) {
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    }
    local_2c4 = 0;
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void registerTest( TestCase const& testCase ) {
            std::string name = testCase.getTestCaseInfo().name;
            if( name == "" ) {
                std::ostringstream oss;
                oss << "Anonymous test case " << ++m_unnamedCount;
                return registerTest( testCase.withName( oss.str() ) );
            }

            if( m_functions.find( testCase ) == m_functions.end() ) {
                m_functions.insert( testCase );
                m_functionsInOrder.push_back( testCase );
                if( !testCase.isHidden() )
                    m_nonHiddenFunctions.push_back( testCase );
            }
            else {
                TestCase const& prev = *m_functions.find( testCase );
                std::cerr   << "error: TEST_CASE( \"" << name << "\" ) already defined.\n"
                            << "\tFirst seen at " << SourceLineInfo( prev.getTestCaseInfo().lineInfo ) << "\n"
                            << "\tRedefined at " << SourceLineInfo( testCase.getTestCaseInfo().lineInfo ) << std::endl;
                exit(1);
            }
        }